

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::SGXMLScanner::normalizeAttValue
          (SGXMLScanner *this,XMLAttDef *attDef,XMLCh *attName,XMLCh *value,XMLBuffer *toFill)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  XMLReader *pXVar4;
  bool bVar5;
  AttTypes local_54;
  XMLCh *local_48;
  XMLCh *srcPtr;
  XMLCh nextCh;
  bool firstNonWS;
  States curState;
  bool isAttTokenizedExternal;
  bool retVal;
  AttTypes type;
  XMLBuffer *toFill_local;
  XMLCh *value_local;
  XMLCh *attName_local;
  XMLAttDef *attDef_local;
  SGXMLScanner *this_local;
  
  if (attDef == (XMLAttDef *)0x0) {
    local_54 = AttTypes_Min;
  }
  else {
    local_54 = XMLAttDef::getType(attDef);
  }
  firstNonWS = true;
  XMLBuffer::reset(toFill);
  if (attDef == (XMLAttDef *)0x0) {
    bVar5 = false;
  }
  else {
    bVar2 = XMLAttDef::isExternal(attDef);
    bVar5 = false;
    if (((((bVar2) && (bVar5 = true, local_54 != ID)) && (bVar5 = true, local_54 != IDRef)) &&
        ((bVar5 = true, local_54 != IDRefs && (bVar5 = true, local_54 != Entity)))) &&
       ((bVar5 = true, local_54 != Entities && (bVar5 = true, local_54 != NmToken)))) {
      bVar5 = local_54 == NmTokens;
    }
  }
  bVar2 = true;
  bVar1 = false;
  local_48 = value;
  if ((local_54 == AttTypes_Min) || (Notation < local_54)) {
    for (; *local_48 != L'\0'; local_48 = local_48 + 1) {
      srcPtr._0_2_ = *local_48;
      if ((XMLCh)srcPtr == L'\xffff') {
        srcPtr._0_2_ = local_48[1];
        local_48 = local_48 + 1;
      }
      else if (((ushort)(XMLCh)srcPtr < 0xe) &&
              ((((XMLCh)srcPtr == L'\t' || ((XMLCh)srcPtr == L'\n')) || ((XMLCh)srcPtr == L'\r'))))
      {
        if (((((this->super_XMLScanner).fStandalone & 1U) != 0) &&
            (((this->super_XMLScanner).fValidate & 1U) != 0)) && (bVar5)) {
          XMLValidator::emitError
                    ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,attName,(XMLCh *)0x0
                     ,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        srcPtr._0_2_ = L' ';
      }
      else if ((XMLCh)srcPtr == L'<') {
        XMLScanner::emitError
                  (&this->super_XMLScanner,BracketInAttrValue,attName,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
        firstNonWS = false;
      }
      XMLBuffer::append(toFill,(XMLCh)srcPtr);
    }
  }
  else {
LAB_00371cec:
    if (*local_48 != L'\0') {
      srcPtr._0_2_ = *local_48;
      if ((XMLCh)srcPtr == L'\xffff') {
        srcPtr._0_2_ = local_48[1];
        local_48 = local_48 + 1;
      }
      else if ((XMLCh)srcPtr == L'<') {
        XMLScanner::emitError
                  (&this->super_XMLScanner,BracketInAttrValue,attName,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
        firstNonWS = false;
      }
      if (!bVar2) {
        pXVar4 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
        bVar3 = XMLReader::isWhitespace(pXVar4,(XMLCh)srcPtr);
        if (bVar3) {
          local_48 = local_48 + 1;
        }
        else {
          if (bVar1) {
            XMLBuffer::append(toFill,L' ');
          }
          bVar2 = true;
          bVar1 = true;
LAB_00371e7d:
          XMLBuffer::append(toFill,(XMLCh)srcPtr);
          local_48 = local_48 + 1;
        }
        goto LAB_00371cec;
      }
      if (!bVar2) goto LAB_00371e7d;
      pXVar4 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
      bVar3 = XMLReader::isWhitespace(pXVar4,(XMLCh)srcPtr);
      if (!bVar3) {
        bVar1 = true;
        goto LAB_00371e7d;
      }
      bVar2 = false;
      local_48 = local_48 + 1;
      if (((((this->super_XMLScanner).fStandalone & 1U) == 0) ||
          (((this->super_XMLScanner).fValidate & 1U) == 0)) || (!bVar5)) goto LAB_00371cec;
      if (bVar1) {
        if (((XMLCh)srcPtr == L' ') || (*local_48 == L'\0')) goto LAB_00371cec;
        pXVar4 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
        bVar3 = XMLReader::isWhitespace(pXVar4,*local_48);
        if (!bVar3) goto LAB_00371cec;
      }
      XMLValidator::emitError
                ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,attName,(XMLCh *)0x0,
                 (XMLCh *)0x0,(XMLCh *)0x0);
      goto LAB_00371cec;
    }
  }
  return firstNonWS;
}

Assistant:

bool SGXMLScanner::normalizeAttValue( const   XMLAttDef* const    attDef
                                      , const XMLCh* const        attName
                                      , const XMLCh* const        value
                                      ,       XMLBuffer&          toFill)
{
    // A simple state value for a whitespace processing state machine
    enum States
    {
        InWhitespace
        , InContent
    };

    // Get the type and name
    const XMLAttDef::AttTypes type = (attDef)
                            ?attDef->getType()
                            :XMLAttDef::CData;

    // Assume its going to go fine, and empty the target buffer in preperation
    bool retVal = true;
    toFill.reset();

    // check to see if it's a tokenized type that is declared externally 
    bool  isAttTokenizedExternal = (attDef)
                                   ?attDef->isExternal() && (type == XMLAttDef::ID || 
                                                             type == XMLAttDef::IDRef || 
                                                             type == XMLAttDef::IDRefs || 
                                                             type == XMLAttDef::Entity || 
                                                             type == XMLAttDef::Entities || 
                                                             type == XMLAttDef::NmToken || 
                                                             type == XMLAttDef::NmTokens)
                                   :false;

    //  Loop through the chars of the source value and normalize it according
    //  to the type.
    States curState = InContent;
    bool firstNonWS = false;
    XMLCh nextCh;
    const XMLCh* srcPtr = value;

    if (type == XMLAttDef::CData || type > XMLAttDef::Notation) {
        while (*srcPtr) {
            //  Get the next character from the source. We have to watch for
            //  escaped characters (which are indicated by a 0xFFFF value followed
            //  by the char that was escaped.)
            nextCh = *srcPtr;

            // Do we have an escaped character ?
            if (nextCh == 0xFFFF)
            {
                nextCh = *++srcPtr;
            }
            else if ( (nextCh <= 0x0D) && (nextCh == 0x09 || nextCh == 0x0A || nextCh == 0x0D) ) {
                // Check Validity Constraint for Standalone document declaration
                // XML 1.0, Section 2.9
                if (fStandalone && fValidate && isAttTokenizedExternal)
                {
                     // Can't have a standalone document declaration of "yes" if  attribute
                     // values are subject to normalisation
                     fValidator->emitError(XMLValid::NoAttNormForStandalone, attName);
                }
                nextCh = chSpace;
            }
            else if (nextCh == chOpenAngle) {
                //  If its not escaped, then make sure its not a < character, which is
                //  not allowed in attribute values.
                emitError(XMLErrs::BracketInAttrValue, attName);
                retVal = false;
            }

            // Add this char to the target buffer
            toFill.append(nextCh);

            // And move up to the next character in the source
            srcPtr++;
        }
    }
    else {
        while (*srcPtr)
        {
            //  Get the next character from the source. We have to watch for
            //  escaped characters (which are indicated by a 0xFFFF value followed
            //  by the char that was escaped.)
            nextCh = *srcPtr;

            // Do we have an escaped character ?
            if (nextCh == 0xFFFF)
            {
                nextCh = *++srcPtr;
            }
            else if (nextCh == chOpenAngle) {
                //  If its not escaped, then make sure its not a < character, which is
                //  not allowed in attribute values.
                emitError(XMLErrs::BracketInAttrValue, attName);
                retVal = false;
            }

            if (curState == InWhitespace)
            {
                if (!fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    if (firstNonWS)
                        toFill.append(chSpace);
                    curState = InContent;
                    firstNonWS = true;
                }
                else
                {
                    srcPtr++;
                    continue;
                }
            }
            else if (curState == InContent)
            {
                if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    curState = InWhitespace;
                    srcPtr++;

                    // Check Validity Constraint for Standalone document declaration
                    // XML 1.0, Section 2.9
                    if (fStandalone && fValidate && isAttTokenizedExternal)
                    {
                        if (!firstNonWS || (nextCh != chSpace && *srcPtr && fReaderMgr.getCurrentReader()->isWhitespace(*srcPtr)))
                        {
                            // Can't have a standalone document declaration of "yes" if  attribute
                            // values are subject to normalisation
                            fValidator->emitError(XMLValid::NoAttNormForStandalone, attName);
                        }
                    }
                    continue;
                }
                firstNonWS = true;
            }

            // Add this char to the target buffer
            toFill.append(nextCh);

            // And move up to the next character in the source
            srcPtr++;
        }
    }

    return retVal;
}